

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_102;
  allocator<char> local_101;
  undefined1 local_100 [16];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_100 + 0x10),tgt,(allocator<char> *)&local_c0);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,(string *)(local_100 + 0x10));
  std::__cxx11::string::~string((string *)(local_100 + 0x10));
  if (this == (cmTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,tgt,&local_101);
    std::operator+(&local_40,"Attempt to add link directories to non-existent target: ",&local_60);
    std::operator+(&local_c0,&local_40," for directory ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,d,&local_102);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_100 + 0x10),&local_c0,&local_80);
    cmSystemTools::Error((string *)(local_100 + 0x10));
    std::__cxx11::string::~string((string *)(local_100 + 0x10));
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,d,(allocator<char> *)&local_c0);
    cmMakefile::GetBacktrace((cmMakefile *)local_100);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_100 + 0x10),&local_a0,(cmListFileBacktrace *)local_100);
    cmTarget::InsertLinkDirectory
              (this,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_100 + 0x10),false);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_100 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100 + 8));
    this_00 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

static void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                              const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: " +
      std::string(tgt) + " for directory " + std::string(d));
    return;
  }
  t->InsertLinkDirectory(BT<std::string>(d, mf->GetBacktrace()));
}